

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O0

bool __thiscall QCommandLineParser::addOption(QCommandLineParser *this,QCommandLineOption *option)

{
  bool bVar1;
  qsizetype qVar2;
  const_iterator o;
  QList<QString> *in_RDI;
  long in_FS_OFFSET;
  QString *name_1;
  QStringList *__range2_1;
  QString *name;
  QStringList *__range2;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  qsizetype offset;
  const_iterator __end2;
  const_iterator __begin2;
  QStringList optionNames;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  undefined1 in_stack_ffffffffffffff38 [16];
  bool local_79;
  const_iterator local_68;
  long local_60;
  QString *local_38;
  const_iterator local_30;
  const_iterator local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QCommandLineOption::names(in_stack_ffffffffffffff38._0_8_);
  bVar1 = QList<QString>::isEmpty((QList<QString> *)0x17543c);
  if (bVar1) {
    local_79 = false;
  }
  else {
    local_28.i = (QString *)0xaaaaaaaaaaaaaaaa;
    local_28 = QList<QString>::begin(in_RDI);
    local_30.i = (QString *)0xaaaaaaaaaaaaaaaa;
    local_30 = QList<QString>::end(in_RDI);
    while( true ) {
      local_38 = local_30.i;
      bVar1 = QList<QString>::const_iterator::operator!=(&local_28,local_30);
      if (!bVar1) break;
      QList<QString>::const_iterator::operator*(&local_28);
      bVar1 = QHash<QString,_long_long>::contains(in_stack_ffffffffffffff38._0_8_,(QString *)in_RDI)
      ;
      if (bVar1) {
        local_79 = false;
        goto LAB_00175689;
      }
      QList<QString>::const_iterator::operator++(&local_28);
    }
    QList<QCommandLineOption>::append
              ((QList<QCommandLineOption> *)in_RDI,
               (parameter_type)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    qVar2 = QList<QCommandLineOption>::size
                      ((QList<QCommandLineOption> *)&(in_RDI->d).d[1].super_QArrayData.alloc);
    local_60 = qVar2 + -1;
    local_68.i = (QString *)0xaaaaaaaaaaaaaaaa;
    local_68 = QList<QString>::begin(in_RDI);
    o = QList<QString>::end(in_RDI);
    while (bVar1 = QList<QString>::const_iterator::operator!=(&local_68,o), bVar1) {
      QList<QString>::const_iterator::operator*(&local_68);
      QHash<QString,_long_long>::insert
                ((QHash<QString,_long_long> *)in_RDI,
                 (QString *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                 (longlong *)0x175657);
      QList<QString>::const_iterator::operator++(&local_68);
    }
    local_79 = true;
  }
LAB_00175689:
  QList<QString>::~QList((QList<QString> *)0x175696);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_79;
}

Assistant:

bool QCommandLineParser::addOption(const QCommandLineOption &option)
{
    const QStringList optionNames = option.names();

    if (!optionNames.isEmpty()) {
        for (const QString &name : optionNames) {
            if (d->nameHash.contains(name)) {
                qWarning("QCommandLineParser: option already added: \"%ls\"", qUtf16Printable(name));
                return false;
            }
        }

        d->commandLineOptionList.append(option);

        const qsizetype offset = d->commandLineOptionList.size() - 1;
        for (const QString &name : optionNames)
            d->nameHash.insert(name, offset);

        return true;
    }

    return false;
}